

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_score.h
# Opt level: O0

void __thiscall xLearn::FMScore::~FMScore(FMScore *this)

{
  void *in_RDI;
  
  ~FMScore((FMScore *)0x202af8);
  operator_delete(in_RDI);
  return;
}

Assistant:

~FMScore() { }